

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_quoted.cpp
# Opt level: O2

void __thiscall Quoted_Simple_Test::TestBody(Quoted_Simple_Test *this)

{
  char *message;
  AssertHelper AStack_1c8;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  stringstream str;
  basic_ostream<char,_std::char_traits<char>_> local_180 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&str);
  local_1b0._M_dataplus._M_p = "simple";
  local_1b0._M_string_length._0_2_ = 0x22;
  std::__detail::operator<<(local_180,(_Quoted_string<const_char_*,_char> *)&local_1b0);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[9]>
            ((internal *)&gtest_ar,"str.str ()","R\"(\"simple\")\"",&local_1b0,
             (char (*) [9])"\"simple\"");
  std::__cxx11::string::~string((string *)&local_1b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1b0);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_73ef0 + 0x50;
    }
    else {
      message = *(char **)gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/support/test_quoted.cpp"
               ,0x1f,message);
    testing::internal::AssertHelper::operator=(&AStack_1c8,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1c8);
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&str);
  return;
}

Assistant:

TEST (Quoted, Simple) {
    std::stringstream str;
    str << pstore::quoted ("simple");
    EXPECT_EQ (str.str (), R"("simple")");
}